

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::getCore(Federate *this,FederateInfo *fedInfo)

{
  CoreType CVar1;
  char *pcVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  Core *__tmp;
  _Alloc_hider _Var9;
  size_type sVar10;
  RegistrationFailure *this_00;
  FederateInfo *fedInfo_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> fedInfo_01;
  FederateInfo *extraout_RDX;
  FederateInfo *extraout_RDX_00;
  FederateInfo *extraout_RDX_01;
  FederateInfo *fedInfo_02;
  FederateInfo *fedInfo_03;
  FederateInfo *extraout_RDX_02;
  FederateInfo *extraout_RDX_03;
  FederateInfo *extraout_RDX_04;
  FederateInfo *extraout_RDX_05;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view coreName;
  string_view coreName_00;
  string_view coreName_01;
  string_view coreName_02;
  string_view message;
  shared_ptr<helics::Core> sVar11;
  string_view configureString;
  string_view configureString_00;
  string_view configureString_01;
  string_view configureString_02;
  string_view fmt;
  string_view message_00;
  string_view configureString_03;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string cname;
  string local_d8;
  string local_b8;
  string local_98;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_68;
  element_type local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar7 = FederateInfo::checkFlagProperty(fedInfo,0x1b,false);
  this->singleThreadFederate = bVar7;
  if ((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  pcVar2 = (char *)(fedInfo->coreName)._M_string_length;
  if (pcVar2 == (char *)0x0) {
    fedInfo_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)fedInfo_00;
    if (fedInfo->forceNewCore == false) {
      sVar11 = CoreFactory::findJoinableCoreOfType((CoreType)&local_d8);
      sVar10 = local_d8._M_string_length;
      _Var9._M_p = local_d8._M_dataplus._M_p;
      fedInfo_01 = sVar11.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var9._M_p;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar10;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        fedInfo_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
          fedInfo_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
        }
        _Var9._M_p = (pointer)(this->coreObject).
                              super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      if ((element_type *)_Var9._M_p != (element_type *)0x0) {
        return;
      }
    }
    if ((this->mName)._M_string_length != 0) {
      gmlc::utilities::randomString_abi_cxx11_(0x238bb3);
      local_d8._M_dataplus._M_p = (this->mName)._M_dataplus._M_p;
      local_d8._M_string_length = (this->mName)._M_string_length;
      local_d8.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
      local_d8.field_2._8_8_ = local_98._M_string_length;
      fmt.size_ = 0xdd;
      fmt.data_ = (char *)0xa;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_d8;
      ::fmt::v11::vformat_abi_cxx11_(&local_b8,(v11 *)"{}_core_{}",fmt,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &this->mName,"${",0,2);
      fedInfo_02 = extraout_RDX_01;
      if (sVar10 != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName
                   ,0,sVar10);
        gmlc::utilities::randomString_abi_cxx11_(0x238ee8);
        local_d8._M_dataplus._M_p = local_50._M_dataplus._M_p;
        local_d8._M_string_length = local_50._M_string_length;
        local_d8.field_2._M_allocated_capacity = (size_type)local_70;
        local_d8.field_2._8_8_ = p_Stack_68;
        fmt_00.size_ = 0xdd;
        fmt_00.data_ = (char *)0xa;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_d8;
        ::fmt::v11::vformat_abi_cxx11_(&local_98,(v11 *)"{}_core_{}",fmt_00,args_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        fedInfo_02 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          fedInfo_02 = extraout_RDX_03;
        }
        if (local_70 != local_60) {
          operator_delete(local_70,(long)local_60[0]._vptr_Core + 1);
          fedInfo_02 = extraout_RDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          fedInfo_02 = extraout_RDX_05;
        }
      }
      sVar6 = local_b8._M_string_length;
      _Var5._M_p = local_b8._M_dataplus._M_p;
      CVar1 = fedInfo->coreType;
      generateFullCoreInitString_abi_cxx11_(&local_d8,(helics *)fedInfo,fedInfo_02);
      coreName_00._M_len = (ulong)CVar1;
      coreName_00._M_str = (char *)sVar6;
      configureString_00._M_str = (char *)local_d8._M_string_length;
      configureString_00._M_len = (size_t)_Var5._M_p;
      CoreFactory::create((CoreType)&local_98,coreName_00,configureString_00);
      sVar6 = local_98._M_string_length;
      _Var5._M_p = local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var5._M_p;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      _Var9._M_p = local_b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return;
      }
      goto LAB_00238eb7;
    }
    CVar1 = fedInfo->coreType;
    generateFullCoreInitString_abi_cxx11_
              (&local_d8,(helics *)fedInfo,(FederateInfo *)fedInfo_01._M_pi);
    configureString_03._M_str = local_d8._M_dataplus._M_p;
    configureString_03._M_len = local_d8._M_string_length;
    CoreFactory::create((CoreFactory *)&local_b8,CVar1,configureString_03);
  }
  else {
    if (fedInfo->forceNewCore == false) {
      CVar1 = fedInfo->coreType;
      pcVar3 = (fedInfo->coreName)._M_dataplus._M_p;
      generateFullCoreInitString_abi_cxx11_(&local_d8,(helics *)fedInfo,fedInfo_00);
      coreName_01._M_len = (ulong)CVar1;
      coreName_01._M_str = pcVar2;
      configureString_01._M_str = (char *)local_d8._M_string_length;
      configureString_01._M_len = (size_t)pcVar3;
      CoreFactory::FindOrCreate((CoreType)&local_b8,coreName_01,configureString_01);
      sVar6 = local_b8._M_string_length;
      _Var5._M_p = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var5._M_p;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      iVar8 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Core[0xb])();
      if ((char)iVar8 != '\0') {
        return;
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      message_00._M_str = "found core object is not open";
      message_00._M_len = 0x1d;
      logMessage(this,3,message_00);
      CoreFactory::cleanUpCores((milliseconds)0xc8);
      CVar1 = fedInfo->coreType;
      pcVar3 = (fedInfo->coreName)._M_dataplus._M_p;
      pcVar2 = (char *)(fedInfo->coreName)._M_string_length;
      generateFullCoreInitString_abi_cxx11_(&local_d8,(helics *)fedInfo,fedInfo_03);
      coreName_02._M_len = (ulong)CVar1;
      coreName_02._M_str = pcVar2;
      configureString_02._M_str = (char *)local_d8._M_string_length;
      configureString_02._M_len = (size_t)pcVar3;
      CoreFactory::FindOrCreate((CoreType)&local_b8,coreName_02,configureString_02);
      sVar6 = local_b8._M_string_length;
      _Var5._M_p = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var5._M_p;
      (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      iVar8 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Core[0xb])();
      if ((char)iVar8 != '\0') {
        return;
      }
      this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      message._M_str = "Unable to connect to specified core: core is not open to new Federates";
      message._M_len = 0x46;
      RegistrationFailure::RegistrationFailure(this_00,message);
      __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    CVar1 = fedInfo->coreType;
    pcVar3 = (fedInfo->coreName)._M_dataplus._M_p;
    generateFullCoreInitString_abi_cxx11_(&local_d8,(helics *)fedInfo,fedInfo_00);
    coreName._M_len = (ulong)CVar1;
    coreName._M_str = pcVar2;
    configureString._M_str = (char *)local_d8._M_string_length;
    configureString._M_len = (size_t)pcVar3;
    CoreFactory::create((CoreType)&local_b8,coreName,configureString);
  }
  sVar6 = local_b8._M_string_length;
  _Var5._M_p = local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var5._M_p;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
  }
  local_b8.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
  _Var9._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return;
  }
LAB_00238eb7:
  operator_delete(_Var9._M_p,
                  (ulong)((long)&((element_type *)local_b8.field_2._M_allocated_capacity)->
                                 _vptr_Core + 1));
  return;
}

Assistant:

void Federate::getCore(const FederateInfo& fedInfo)
{
    singleThreadFederate = fedInfo.checkFlagProperty(defs::Flags::SINGLE_THREAD_FEDERATE, false);
    if (coreObject) {
        return;
    }

    if (fedInfo.coreName.empty()) {
        if (!fedInfo.forceNewCore) {
            coreObject = CoreFactory::findJoinableCoreOfType(fedInfo.coreType);
        }
        if (!coreObject) {
            if (!mName.empty()) {
                std::string cname =
                    fmt::format("{}_core_{}", mName, gmlc::utilities::randomString(6));
                auto loc = mName.find("${");
                if (loc != std::string::npos) {
                    cname = fmt::format("{}_core_{}",
                                        mName.substr(0, loc),
                                        gmlc::utilities::randomString(8));
                }
                try {
                    coreObject = CoreFactory::create(fedInfo.coreType,
                                                     cname,
                                                     generateFullCoreInitString(fedInfo));
                }
                catch (const helics::RegistrationFailure&) {
                    // there is a possibility of race condition here in the naming resulting a
                    // failure this catches and reverts to previous naming which is fully randomly
                    // generated
                    coreObject =
                        CoreFactory::create(fedInfo.coreType, generateFullCoreInitString(fedInfo));
                }
            } else {
                coreObject =
                    CoreFactory::create(fedInfo.coreType, generateFullCoreInitString(fedInfo));
            }
        }
    } else {
        if (!fedInfo.forceNewCore) {
            coreObject = CoreFactory::FindOrCreate(fedInfo.coreType,
                                                   fedInfo.coreName,
                                                   generateFullCoreInitString(fedInfo));
            if (!coreObject->isOpenToNewFederates()) {
                coreObject = nullptr;
                logWarningMessage("found core object is not open");
                CoreFactory::cleanUpCores(200ms);
                coreObject = CoreFactory::FindOrCreate(fedInfo.coreType,
                                                       fedInfo.coreName,
                                                       generateFullCoreInitString(fedInfo));
                if (!coreObject->isOpenToNewFederates()) {
                    throw(RegistrationFailure(
                        "Unable to connect to specified core: core is not open to new Federates"));
                }
            }
        } else {
            coreObject = CoreFactory::create(fedInfo.coreType,
                                             fedInfo.coreName,
                                             generateFullCoreInitString(fedInfo));
        }
    }
}